

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::InterceptorConfig::InterceptorConfig
          (InterceptorConfig *this,InterceptorConfig *param_1)

{
  _WordT _Var1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__InterceptorConfig_004078e8;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  ::std::__cxx11::string::string
            ((string *)&this->console_config_,(string *)&param_1->console_config_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  _Var1 = (param_1->_has_field_).super__Base_bitset<2UL>._M_w[1];
  (this->_has_field_).super__Base_bitset<2UL>._M_w[0] =
       (param_1->_has_field_).super__Base_bitset<2UL>._M_w[0];
  (this->_has_field_).super__Base_bitset<2UL>._M_w[1] = _Var1;
  return;
}

Assistant:

InterceptorConfig::InterceptorConfig(InterceptorConfig&&) noexcept = default;